

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config_format.hpp
# Opt level: O0

void lightconf::config_format::write_vector(scanner *sc,writer *wr,value_vector_type *vec)

{
  value_vector_type *pvVar1;
  writer *sc_00;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  size_type sVar5;
  const_reference pvVar6;
  bool local_319;
  allocator local_2e1;
  string local_2e0;
  allocator local_2b9;
  string local_2b8;
  allocator local_291;
  string local_290;
  allocator local_269;
  string local_268;
  undefined1 local_248 [8];
  scanner dummy_scanner;
  uint i;
  allocator local_1a1;
  string local_1a0;
  token local_180;
  undefined1 local_139;
  undefined1 local_138 [7];
  bool terminate;
  token local_a0;
  uint local_60;
  uint vals_read;
  allocator local_49;
  string local_48;
  byte local_21;
  value_vector_type *pvStack_20;
  bool wrap;
  value_vector_type *vec_local;
  writer *wr_local;
  scanner *sc_local;
  
  pvStack_20 = vec;
  vec_local = (value_vector_type *)wr;
  wr_local = (writer *)sc;
  iVar3 = vector_length(vec,0x78);
  pvVar1 = vec_local;
  local_21 = *(int *)&vec_local[5].
                      super__Vector_base<lightconf::value,_std::allocator<lightconf::value>_>.
                      _M_impl.super__Vector_impl_data._M_start < iVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"[ ",&local_49);
  writer::append((writer *)pvVar1,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  writer::indent((writer *)vec_local);
  if ((local_21 & 1) != 0) {
    writer::newline((writer *)vec_local);
  }
  scanner::expect((scanner *)wr_local,'[',false);
  local_60 = 0;
  while( true ) {
    scanner::peek_token(&local_a0,(scanner *)wr_local);
    bVar2 = token::is_char(&local_a0,']');
    token::~token(&local_a0);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    uVar4 = (ulong)local_60;
    sVar5 = std::vector<lightconf::value,_std::allocator<lightconf::value>_>::size(pvStack_20);
    sc_00 = wr_local;
    pvVar1 = vec_local;
    if (uVar4 < sVar5) {
      pvVar6 = std::vector<lightconf::value,_std::allocator<lightconf::value>_>::operator[]
                         (pvStack_20,(ulong)local_60);
      write_value((scanner *)sc_00,(writer *)pvVar1,pvVar6);
      local_60 = local_60 + 1;
    }
    else {
      read_value((value *)local_138,(scanner *)wr_local);
      value::~value((value *)local_138);
    }
    scanner::peek_token(&local_180,(scanner *)wr_local);
    bVar2 = token::is_char(&local_180,']');
    local_319 = false;
    if (bVar2) {
      uVar4 = (ulong)local_60;
      sVar5 = std::vector<lightconf::value,_std::allocator<lightconf::value>_>::size(pvStack_20);
      local_319 = uVar4 == sVar5;
    }
    token::~token(&local_180);
    pvVar1 = vec_local;
    local_139 = local_319;
    if (local_319 == false) {
      if ((local_21 & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_1a0,", ",&local_1a1);
        writer::append((writer *)pvVar1,&local_1a0);
        std::__cxx11::string::~string((string *)&local_1a0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
      }
      else {
        writer::newline((writer *)vec_local);
      }
    }
    else if ((local_21 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&i," ",(allocator *)&dummy_scanner.params_.field_0x27);
      writer::append((writer *)pvVar1,(string *)&i);
      std::__cxx11::string::~string((string *)&i);
      std::allocator<char>::~allocator((allocator<char> *)&dummy_scanner.params_.field_0x27);
    }
    scanner::expect((scanner *)wr_local,',',true);
  }
  for (dummy_scanner.params_.flags = local_60; uVar4 = (ulong)(uint)dummy_scanner.params_.flags,
      sVar5 = std::vector<lightconf::value,_std::allocator<lightconf::value>_>::size(pvStack_20),
      uVar4 < sVar5; dummy_scanner.params_.flags = dummy_scanner.params_.flags + 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_268,"0",&local_269);
    make_scanner((scanner *)local_248,&local_268);
    std::__cxx11::string::~string((string *)&local_268);
    std::allocator<char>::~allocator((allocator<char> *)&local_269);
    pvVar1 = vec_local;
    pvVar6 = std::vector<lightconf::value,_std::allocator<lightconf::value>_>::operator[]
                       (pvStack_20,(ulong)(uint)dummy_scanner.params_.flags);
    write_value((scanner *)local_248,(writer *)pvVar1,pvVar6);
    uVar4 = (ulong)(uint)dummy_scanner.params_.flags;
    sVar5 = std::vector<lightconf::value,_std::allocator<lightconf::value>_>::size(pvStack_20);
    pvVar1 = vec_local;
    if (uVar4 < sVar5 - 1) {
      if ((local_21 & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_290,", ",&local_291);
        writer::append((writer *)pvVar1,&local_290);
        std::__cxx11::string::~string((string *)&local_290);
        std::allocator<char>::~allocator((allocator<char> *)&local_291);
      }
      else {
        writer::newline((writer *)vec_local);
      }
    }
    else if ((local_21 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_2b8," ",&local_2b9);
      writer::append((writer *)pvVar1,&local_2b8);
      std::__cxx11::string::~string((string *)&local_2b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
    }
    scanner::~scanner((scanner *)local_248);
  }
  writer::unindent((writer *)vec_local);
  if ((local_21 & 1) != 0) {
    writer::newline((writer *)vec_local);
  }
  scanner::expect((scanner *)wr_local,']',false);
  pvVar1 = vec_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2e0,"]",&local_2e1);
  writer::append((writer *)pvVar1,&local_2e0);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
  return;
}

Assistant:

inline void write_vector(scanner& sc, writer& wr, const value_vector_type& vec) {
    bool wrap = vector_length(vec) > wr.wrap_length;

    wr.append("[ ");
    wr.indent();
    if (wrap) {
        wr.newline();
    }
    sc.expect('[');

    unsigned int vals_read = 0;
    while (!sc.peek_token().is_char(']')) {
        if (vals_read < vec.size()) {
            write_value(sc, wr, vec[vals_read]);
            vals_read++;
        } else {
            read_value(sc);
        }

        bool terminate = sc.peek_token().is_char(']') && vals_read == vec.size();
        if (!terminate) {
            if (wrap) {
                wr.newline();
            } else {
                wr.append(", ");
            }
        } else if (!wrap) {
            wr.append(" ");
        }
        sc.expect(',', true);
    }

    for (unsigned int i = vals_read; i < vec.size(); i++) {
        scanner dummy_scanner = make_scanner("0");
        write_value(dummy_scanner, wr, vec[i]);
        if (i < vec.size() - 1) {
            if (wrap) {
                wr.newline();
            } else {
                wr.append(", ");
            }
        } else if (!wrap) {
            wr.append(" ");
        }
    }

    wr.unindent();
    if (wrap) {
        wr.newline();
    }

    sc.expect(']');
    wr.append("]");
}